

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS580314BA.h
# Opt level: O3

int ReadDataMS580314BA(MS580314BA *pMS580314BA,int ind,unsigned_long *pValue)

{
  int iVar1;
  ssize_t sVar2;
  char *__s;
  uint uVar3;
  ulong uVar4;
  uint8 writebuf [3];
  uint8 readbuf [50];
  undefined2 local_6b;
  undefined1 local_69;
  timespec local_68 [4];
  
  local_6b = 0xef54;
  local_69 = 3;
  iVar1 = (pMS580314BA->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pMS580314BA->RS232Port).s;
    uVar4 = 0;
    do {
      sVar2 = send(iVar1,(void *)((long)&local_6b + uVar4),(ulong)(3 - (int)uVar4),0);
      if ((int)sVar2 < 1) goto LAB_001bd366;
      uVar3 = (int)uVar4 + (int)sVar2;
      uVar4 = (ulong)uVar3;
    } while ((int)uVar3 < 3);
  }
  else {
    if (iVar1 != 0) {
LAB_001bd366:
      __s = "Error writing data to a MS580314BA. ";
      goto LAB_001bd3b4;
    }
    iVar1 = *(int *)&(pMS580314BA->RS232Port).hDev;
    uVar4 = 0;
    do {
      sVar2 = write(iVar1,(void *)((long)&local_6b + uVar4),(ulong)(3 - (int)uVar4));
      if ((int)sVar2 < 1) goto LAB_001bd366;
      uVar3 = (int)uVar4 + (int)sVar2;
      uVar4 = (ulong)uVar3;
    } while (uVar3 < 3);
  }
  local_68[0].tv_sec = 0;
  local_68[0].tv_nsec = 10000000;
  nanosleep(local_68,(timespec *)0x0);
  iVar1 = (pMS580314BA->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    sVar2 = recv((pMS580314BA->RS232Port).s,local_68,0x32,0);
    iVar1 = (int)sVar2;
LAB_001bd385:
    if (0 < iVar1) {
      if (ind == 1) {
        uVar3 = (uint)local_68[0].tv_sec._3_1_ << 8 | (uint)local_68[0].tv_sec._2_1_ << 0x10;
        local_68[0].tv_sec._5_1_ = local_68[0].tv_sec._4_1_;
      }
      else {
        if (ind != 0) {
          return 0;
        }
        uVar3 = (uint)local_68[0].tv_sec._4_1_ << 8 | (uint)local_68[0].tv_sec._3_1_ << 0x10;
      }
      *pValue = (ulong)local_68[0].tv_sec._5_1_ | (ulong)uVar3;
      return 0;
    }
  }
  else if (iVar1 == 0) {
    sVar2 = read(*(int *)&(pMS580314BA->RS232Port).hDev,local_68,0x32);
    iVar1 = (int)sVar2;
    goto LAB_001bd385;
  }
  __s = "Error reading data from a MS580314BA. ";
LAB_001bd3b4:
  puts(__s);
  return 1;
}

Assistant:

inline int ReadDataMS580314BA(MS580314BA* pMS580314BA, int ind, unsigned long* pValue)
{
	uint8 writebuf[3];
	uint8 readbuf[50];
	int nbReadBytes = 0;
	
	writebuf[0] = (uint8)0x54; // Read or Write multiple bytes for devices without internal address or where address does not require resetting.
	writebuf[1] = (uint8)0xEF; // I2C address
	writebuf[2] = (uint8)0x03; // Number of bytes

	if (WriteAllRS232Port(&pMS580314BA->RS232Port, writebuf, 3) != EXIT_SUCCESS)
	{ 
		printf("Error writing data to a MS580314BA. \n");
		return EXIT_FAILURE;
	}

	mSleep(10);

	if (ReadRS232Port(&pMS580314BA->RS232Port, readbuf, 50, &nbReadBytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a MS580314BA. \n");
		return EXIT_FAILURE;
	}

	//printf("%d  %d  %d  %d  %d  %d  %d  %d \n",buf[0],buf[1],buf[2],buf[3],buf[4],buf[5],buf[6],buf[7]);
	if (ind == 0) { *pValue = readbuf[3] * (unsigned long)65536 + readbuf[4] * (unsigned long)256 + readbuf[5]; }
	if (ind == 1) { *pValue = readbuf[2] * (unsigned long)65536 + readbuf[3] * (unsigned long)256 + readbuf[4]; }
	//printf(" %d  \n",ret);

	return EXIT_SUCCESS;
}